

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O0

void __thiscall primesum::BinaryIndexedTree::update(BinaryIndexedTree *this,int64_t n,int64_t low)

{
  ulong *puVar1;
  long in_RDX;
  ulong in_RSI;
  vector<__int128,_std::allocator<__int128>_> *in_RDI;
  int64_t pos;
  ulong local_20;
  
  local_20 = (long)(in_RSI - in_RDX) >> 1;
  do {
    puVar1 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[](in_RDI,local_20);
    puVar1[1] = (puVar1[1] - ((long)in_RSI >> 0x3f)) - (ulong)(*puVar1 < in_RSI);
    *puVar1 = *puVar1 - in_RSI;
    local_20 = local_20 + 1 | local_20;
  } while ((long)local_20 <
           (long)in_RDI[1].super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start);
  return;
}

Assistant:

void update(int64_t n, int64_t low)
  {
    int64_t pos = n - low;
    pos >>= 1;
    do {
      tree_[pos] -= n;
      pos |= pos + 1;
    }
    while (pos < size_);
  }